

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

MultiIndexSet * __thiscall
TasGrid::GridGlobal::selectTensors
          (MultiIndexSet *__return_storage_ptr__,GridGlobal *this,size_t dims,int depth,
          TypeDepth type,vector<int,_std::allocator<int>_> *anisotropic_weights,TypeOneDRule crule,
          vector<int,_std::allocator<int>_> *level_limits)

{
  TypeDepth TVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  anon_class_8_1_a7c29cff local_108;
  function<int_(int)> local_100;
  anon_class_8_1_a7c29cff local_e0;
  function<int_(int)> local_d8;
  anon_class_8_1_8991fb9c local_b8;
  function<int_(int)> local_b0;
  anon_class_8_1_8991fb9c local_90;
  function<int_(int)> local_88;
  anon_class_1_0_00000001 local_51;
  function<int_(int)> local_50;
  vector<int,_std::allocator<int>_> *local_30;
  vector<int,_std::allocator<int>_> *anisotropic_weights_local;
  TypeDepth type_local;
  int depth_local;
  size_t dims_local;
  GridGlobal *this_local;
  
  local_30 = anisotropic_weights;
  anisotropic_weights_local._0_4_ = type;
  anisotropic_weights_local._4_4_ = depth;
  _type_local = dims;
  dims_local = (size_t)this;
  this_local = (GridGlobal *)__return_storage_ptr__;
  bVar4 = OneDimensionalMeta::isExactLevel(type);
  sVar3 = _type_local;
  iVar2 = anisotropic_weights_local._4_4_;
  TVar1 = (TypeDepth)anisotropic_weights_local;
  if (bVar4) {
    ::std::function<int(int)>::
    function<TasGrid::GridGlobal::selectTensors(unsigned_long,int,TasGrid::TypeDepth,std::vector<int,std::allocator<int>>const&,TasGrid::TypeOneDRule,std::vector<int,std::allocator<int>>const&)const::__0,void>
              ((function<int(int)> *)&local_50,&local_51);
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,sVar3,iVar2,TVar1,&local_50,
               (vector<int,_std::allocator<int>_> *)local_30,
               (vector<int,_std::allocator<int>_> *)level_limits);
    ::std::function<int_(int)>::~function((function<int_(int)> *)&local_50);
  }
  else if (crule == rule_customtabulated) {
    bVar4 = OneDimensionalMeta::isExactQuadrature((TypeDepth)anisotropic_weights_local);
    sVar3 = _type_local;
    iVar2 = anisotropic_weights_local._4_4_;
    TVar1 = (TypeDepth)anisotropic_weights_local;
    if (bVar4) {
      local_90.this = this;
      ::std::function<int(int)>::
      function<TasGrid::GridGlobal::selectTensors(unsigned_long,int,TasGrid::TypeDepth,std::vector<int,std::allocator<int>>const&,TasGrid::TypeOneDRule,std::vector<int,std::allocator<int>>const&)const::__1,void>
                ((function<int(int)> *)&local_88,&local_90);
      MultiIndexManipulations::selectTensors
                (__return_storage_ptr__,sVar3,iVar2,TVar1,&local_88,
                 (vector<int,_std::allocator<int>_> *)local_30,
                 (vector<int,_std::allocator<int>_> *)level_limits);
      ::std::function<int_(int)>::~function((function<int_(int)> *)&local_88);
    }
    else {
      local_b8.this = this;
      ::std::function<int(int)>::
      function<TasGrid::GridGlobal::selectTensors(unsigned_long,int,TasGrid::TypeDepth,std::vector<int,std::allocator<int>>const&,TasGrid::TypeOneDRule,std::vector<int,std::allocator<int>>const&)const::__2,void>
                ((function<int(int)> *)&local_b0,&local_b8);
      MultiIndexManipulations::selectTensors
                (__return_storage_ptr__,sVar3,iVar2,TVar1,&local_b0,
                 (vector<int,_std::allocator<int>_> *)local_30,
                 (vector<int,_std::allocator<int>_> *)level_limits);
      ::std::function<int_(int)>::~function((function<int_(int)> *)&local_b0);
    }
  }
  else {
    bVar4 = OneDimensionalMeta::isExactQuadrature((TypeDepth)anisotropic_weights_local);
    sVar3 = _type_local;
    iVar2 = anisotropic_weights_local._4_4_;
    TVar1 = (TypeDepth)anisotropic_weights_local;
    if (bVar4) {
      local_e0.crule = &crule;
      ::std::function<int(int)>::
      function<TasGrid::GridGlobal::selectTensors(unsigned_long,int,TasGrid::TypeDepth,std::vector<int,std::allocator<int>>const&,TasGrid::TypeOneDRule,std::vector<int,std::allocator<int>>const&)const::__3,void>
                ((function<int(int)> *)&local_d8,&local_e0);
      MultiIndexManipulations::selectTensors
                (__return_storage_ptr__,sVar3,iVar2,TVar1,&local_d8,
                 (vector<int,_std::allocator<int>_> *)local_30,
                 (vector<int,_std::allocator<int>_> *)level_limits);
      ::std::function<int_(int)>::~function((function<int_(int)> *)&local_d8);
    }
    else {
      local_108.crule = &crule;
      ::std::function<int(int)>::
      function<TasGrid::GridGlobal::selectTensors(unsigned_long,int,TasGrid::TypeDepth,std::vector<int,std::allocator<int>>const&,TasGrid::TypeOneDRule,std::vector<int,std::allocator<int>>const&)const::__4,void>
                ((function<int(int)> *)&local_100,&local_108);
      MultiIndexManipulations::selectTensors
                (__return_storage_ptr__,sVar3,iVar2,TVar1,&local_100,
                 (vector<int,_std::allocator<int>_> *)local_30,
                 (vector<int,_std::allocator<int>_> *)level_limits);
      ::std::function<int_(int)>::~function((function<int_(int)> *)&local_100);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet GridGlobal::selectTensors(size_t dims, int depth, TypeDepth type, const std::vector<int> &anisotropic_weights,
                                        TypeOneDRule crule, std::vector<int> const &level_limits) const{
    if (OneDimensionalMeta::isExactLevel(type)){ // no need to know exactness
        return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return l; },
                                                      anisotropic_weights, level_limits);
    }else{ // work with exactness specific to the rule
        if (crule == rule_customtabulated){
            if (OneDimensionalMeta::isExactQuadrature(type)){
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return custom.getQExact(l); },
                                                              anisotropic_weights, level_limits);
            }else{
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return custom.getIExact(l); },
                                                              anisotropic_weights, level_limits);
            }
        }else{ // using regular OneDimensionalMeta
            if (OneDimensionalMeta::isExactQuadrature(type)){
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return OneDimensionalMeta::getQExact(l, crule); },
                                                              anisotropic_weights, level_limits);
            }else{
                return MultiIndexManipulations::selectTensors(dims, depth, type, [&](int l) -> int{ return OneDimensionalMeta::getIExact(l, crule); },
                                                              anisotropic_weights, level_limits);
            }
        }
    }
}